

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O1

void Lpk_ComposeSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nVars,int iCofVar,Lpk_Set_t *pStore,
                    int *pSize,int nSizeLimit)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  char cVar10;
  uint *puVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  Lpk_Set_t *pLVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  uint local_90;
  long local_80;
  
  iVar12 = Lpk_ComposeSets::nTravId;
  if (Lpk_ComposeSets::nTravId == 0x40000000) {
    memset(Lpk_ComposeSets::TravId,0,0x40000);
  }
  iVar4 = iVar12 + 1;
  Lpk_ComposeSets::nTravId = iVar4;
  if (0x20 < nVars) {
    __assert_fail("nBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0xe4,"unsigned int Kit_BitMask(int)");
  }
  iVar2 = vSets0->nSize;
  if ((long)iVar2 < 1) {
    local_90 = 0;
  }
  else {
    piVar3 = vSets0->pArray;
    uVar15 = vSets1->nSize;
    local_80 = 0;
    local_90 = 0;
    do {
      if (0 < (int)uVar15) {
        uVar20 = piVar3[local_80];
        puVar11 = (uint *)vSets1->pArray;
        uVar19 = uVar20 & 0xffff;
        uVar6 = uVar19 - (uVar20 >> 1 & 0x5555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        lVar16 = 0;
        do {
          if (uVar19 != 0) {
            uVar5 = *puVar11 & 0xffff;
            if (((uVar5 != 0) &&
                (((uVar5 | uVar19) ^ (-1 << ((byte)nVars & 0x1f) | 1 << (iCofVar & 0x1fU))) !=
                 0xffffffff)) &&
               ((1 < ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18 ||
                (uVar5 = uVar5 - (uVar5 >> 1 & 0x5555),
                uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333),
                1 < ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18)))) {
              uVar14 = *puVar11 | uVar20;
              uVar5 = (uVar14 >> 1 & 0x5555) + (uVar14 & 0x5555);
              uVar5 = (uVar5 >> 2 & 0x3333) + (uVar5 & 0x3333);
              uVar5 = (uVar5 >> 4 & 0x707) + (uVar5 & 0x707);
              uVar8 = uVar14 >> 0x10 & uVar14;
              uVar8 = (uVar8 >> 1 & 0x5555) + (uVar8 & 0x5555);
              uVar8 = (uVar8 >> 2 & 0x3333) + (uVar8 & 0x3333);
              uVar8 = (uVar8 >> 4 & 0x707) + (uVar8 & 0x707);
              uVar8 = (uVar8 >> 8) + (uVar8 & 0xff);
              iVar7 = ~uVar8 + (uVar5 >> 8) + (uVar5 & 0xff);
              if (0 < iVar7) {
                uVar5 = uVar14 & 0xffff;
                if (iVar12 < Lpk_ComposeSets::TravId[uVar5]) {
                  if ((Lpk_ComposeSets::TravId[uVar5] != iVar4) ||
                     (iVar7 <= Lpk_ComposeSets::SRed[uVar5])) goto LAB_004e1221;
                }
                else {
                  lVar13 = (long)(int)local_90;
                  local_90 = local_90 + 1;
                  Lpk_ComposeSets::Used[lVar13] = (unsigned_short)uVar14;
                }
                Lpk_ComposeSets::TravId[uVar5] = iVar4;
                Lpk_ComposeSets::SRed[uVar5] = (char)iVar7;
                Lpk_ComposeSets::Over[uVar5] = (char)uVar8;
                Lpk_ComposeSets::Parents[uVar5] = (uint)lVar16 | (uint)local_80;
              }
            }
          }
LAB_004e1221:
          lVar16 = lVar16 + 0x10000;
          puVar11 = puVar11 + 1;
        } while ((ulong)uVar15 << 0x10 != lVar16);
      }
      local_80 = local_80 + 1;
    } while (local_80 != iVar2);
  }
  if ((int)local_90 < 1) {
    iVar12 = 1000;
  }
  else {
    iVar12 = 1000;
    lVar16 = 0;
    do {
      iVar4 = (int)Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + lVar16)];
      if (iVar12 < Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + lVar16)]) {
        iVar4 = iVar12;
      }
      iVar12 = iVar4;
      lVar16 = lVar16 + 2;
    } while ((ulong)local_90 * 2 != lVar16);
  }
  if (0 < (int)local_90) {
    lVar16 = 0;
    do {
      uVar1 = *(ushort *)((long)Lpk_ComposeSets::Used + lVar16);
      if (iVar12 == Lpk_ComposeSets::Over[uVar1]) {
        iVar4 = *pSize;
        if (iVar4 == nSizeLimit) {
          return;
        }
        *pSize = iVar4 + 1;
        uVar15 = Lpk_ComposeSets::Parents[uVar1] & 0xffff;
        if (vSets0->nSize <= (int)uVar15) {
LAB_004e141d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pLVar17 = pStore + iVar4;
        uVar20 = Lpk_ComposeSets::Parents[uVar1] >> 0x10;
        uVar15 = vSets0->pArray[uVar15];
        pLVar17->uSubset0 = uVar15;
        if (vSets1->nSize <= (int)uVar20) goto LAB_004e141d;
        uVar20 = vSets1->pArray[uVar20];
        pLVar17->uSubset1 = uVar20;
        uVar15 = uVar15 | uVar20;
        pLVar17->iVar = (char)iCofVar;
        uVar20 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555);
        uVar20 = (uVar20 >> 2 & 0x3333) + (uVar20 & 0x3333);
        iVar4 = (uVar20 >> 4 & 0x707) + (uVar20 & 0x707);
        cVar18 = (char)((uint)iVar4 >> 8) + (char)iVar4;
        pLVar17->Size = cVar18;
        uVar15 = uVar15 >> 0x10 & uVar15;
        uVar15 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555);
        uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333);
        iVar4 = (uVar15 >> 4 & 0x707) + (uVar15 & 0x707);
        bVar9 = (char)((uint)iVar4 >> 8) + (char)iVar4;
        pLVar17->Over = bVar9;
        bVar9 = ~bVar9;
        cVar10 = bVar9 + cVar18;
        pLVar17->SRed = cVar10;
        if (cVar10 == '\0' || SCARRY1(bVar9,cVar18) != cVar10 < '\0') {
          __assert_fail("pEntry->SRed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkSets.c"
                        ,0x11a,
                        "void Lpk_ComposeSets(Vec_Int_t *, Vec_Int_t *, int, int, Lpk_Set_t *, int *, int)"
                       );
        }
      }
      lVar16 = lVar16 + 2;
    } while ((ulong)local_90 * 2 != lVar16);
  }
  return;
}

Assistant:

void Lpk_ComposeSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nVars, int iCofVar,
    Lpk_Set_t * pStore, int * pSize, int nSizeLimit )
{
    static int nTravId = 0;            // the number of the times this is visited
    static int TravId[1<<16] = {0};    // last visited
    static char SRed[1<<16];           // best support reduction
    static char Over[1<<16];           // best overlaps
    static unsigned Parents[1<<16];    // best set of parents
    static unsigned short Used[1<<16]; // storage for used subsets
    int nSuppSize, nSuppOver, nSuppRed, nUsed, nMinOver, i, k, s;
    unsigned Entry, Entry0, Entry1;
    unsigned uSupp, uSupp0, uSupp1, uSuppTotal;
    Lpk_Set_t * pEntry;

    if ( nTravId == (1 << 30) )
        memset( TravId, 0, sizeof(int) * (1 << 16) );

    // collect support reducing subsets
    nUsed = 0;
    nTravId++;
    uSuppTotal = Kit_BitMask(nVars) & ~(1<<iCofVar);
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        uSupp0 = (Entry0 & 0xFFFF);
        uSupp1 = (Entry1 & 0xFFFF);
        // skip trivial
        if ( uSupp0 == 0 || uSupp1 == 0 || (uSupp0 | uSupp1) == uSuppTotal )
            continue;
        if ( Kit_WordHasOneBit(uSupp0) && Kit_WordHasOneBit(uSupp1) )
            continue;
        // get the entry
        Entry = Entry0 | Entry1;
        uSupp = Entry & 0xFFFF;
        // set the bound set size
        nSuppSize = Kit_WordCountOnes( uSupp );
        // get the number of overlapping vars
        nSuppOver = Kit_WordCountOnes( Entry & (Entry >> 16) );
        // get the support reduction
        nSuppRed  = nSuppSize - 1 - nSuppOver;
        // only consider support-reducing subsets
        if ( nSuppRed <= 0 )
            continue;
        // check if this support is already used
        if ( TravId[uSupp] < nTravId )
        {
            Used[nUsed++] = uSupp;

            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
        else if ( TravId[uSupp] == nTravId && SRed[uSupp] < nSuppRed )
        {
            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
    }

    // find the minimum overlap
    nMinOver = 1000;
    for ( s = 0; s < nUsed; s++ )
        if ( nMinOver > Over[Used[s]] )
            nMinOver = Over[Used[s]];


    // collect the accumulated ones
    for ( s = 0; s < nUsed; s++ )
        if ( Over[Used[s]] == nMinOver )
        {
            // save the entry
            if ( *pSize == nSizeLimit )
                return;
            pEntry = pStore + (*pSize)++;

            i = Parents[Used[s]] & 0xFFFF;
            k = Parents[Used[s]] >> 16;

            pEntry->uSubset0 = Vec_IntEntry(vSets0, i);
            pEntry->uSubset1 = Vec_IntEntry(vSets1, k);
            Entry  = pEntry->uSubset0 | pEntry->uSubset1;

            // record the cofactoring variable
            pEntry->iVar = iCofVar;
            // set the bound set size
            pEntry->Size = Kit_WordCountOnes( Entry & 0xFFFF );
            // get the number of overlapping vars
            pEntry->Over = Kit_WordCountOnes( Entry & (Entry >> 16) );
            // get the support reduction
            pEntry->SRed = pEntry->Size - 1 - pEntry->Over;
            assert( pEntry->SRed > 0 );
        }
}